

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_State::add_object(Dispatch_State *this,string *t_name,Boxed_Value *obj)

{
  Dispatch_Engine *this_00;
  Stack_Holder *t_holder;
  Boxed_Value local_50;
  string local_40;
  Boxed_Value *local_20;
  Boxed_Value *obj_local;
  string *t_name_local;
  Dispatch_State *this_local;
  
  local_20 = obj;
  obj_local = (Boxed_Value *)t_name;
  t_name_local = (string *)this;
  this_00 = std::reference_wrapper<chaiscript::detail::Dispatch_Engine>::get(&this->m_engine);
  std::__cxx11::string::string
            ((string *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj_local);
  Boxed_Value::Boxed_Value(&local_50,obj);
  t_holder = std::reference_wrapper<chaiscript::detail::Stack_Holder>::get(&this->m_stack_holder);
  Dispatch_Engine::add_object(this_00,&local_40,&local_50,t_holder);
  Boxed_Value::~Boxed_Value(&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void add_object(const std::string &t_name, Boxed_Value obj) const {
        m_engine.get().add_object(t_name, std::move(obj), m_stack_holder.get());
      }